

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O2

void __thiscall
OpenMD::IntegratorBuilder<OpenMD::NPAT>::~IntegratorBuilder(IntegratorBuilder<OpenMD::NPAT> *this)

{
  IntegratorCreator::~IntegratorCreator(&this->super_IntegratorCreator);
  operator_delete(this,0x28);
  return;
}

Assistant:

IntegratorBuilder(const std::string& ident) : IntegratorCreator(ident) {}